

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O2

uint32_t FAudio_CreateSourceVoice
                   (FAudio *audio,FAudioSourceVoice **ppSourceVoice,
                   FAudioWaveFormatEx *pSourceFormat,uint32_t Flags,float MaxFrequencyRatio,
                   FAudioVoiceCallback *pCallback,FAudioVoiceSends *pSendList,
                   FAudioEffectChain *pEffectChain)

{
  undefined1 *puVar1;
  uint16_t uVar2;
  uint uVar3;
  FAudioVoice *voice;
  uint32_t uVar4;
  int iVar5;
  FAudioSourceVoice *pFVar6;
  FAudioMutex pvVar7;
  FAudioWaveFormatEx *pFVar8;
  float *pfVar9;
  FAudioFilterState *pafVar10;
  code *pcVar11;
  FAudioResampleCallback *pp_Var12;
  ulong uVar13;
  FAudioGUID *pFVar14;
  long lVar15;
  double dVar16;
  
  pFVar6 = (FAudioSourceVoice *)(*audio->pMalloc)(0x148);
  *ppSourceVoice = pFVar6;
  SDL_memset(pFVar6,0,0x148);
  (*ppSourceVoice)->audio = audio;
  pFVar6 = *ppSourceVoice;
  pFVar6->type = FAUDIO_VOICE_SOURCE;
  pFVar6->flags = Flags;
  (pFVar6->filter).Type = FAudioLowPassFilter;
  (pFVar6->filter).Frequency = 1.0;
  (pFVar6->filter).OneOverQ = 1.0;
  pvVar7 = FAudio_PlatformCreateMutex();
  (*ppSourceVoice)->sendLock = pvVar7;
  pvVar7 = FAudio_PlatformCreateMutex();
  (*ppSourceVoice)->effectLock = pvVar7;
  pvVar7 = FAudio_PlatformCreateMutex();
  (*ppSourceVoice)->filterLock = pvVar7;
  pvVar7 = FAudio_PlatformCreateMutex();
  (*ppSourceVoice)->volumeLock = pvVar7;
  ((*ppSourceVoice)->field_19).src.maxFreqRatio = MaxFrequencyRatio;
  uVar2 = pSourceFormat->wFormatTag;
  if (uVar2 == 1) {
LAB_0011280a:
    pFVar8 = (FAudioWaveFormatEx *)(*audio->pMalloc)(0x28);
    pFVar8->wFormatTag = 0xfffe;
    pFVar8->nChannels = pSourceFormat->nChannels;
    uVar4 = pSourceFormat->nAvgBytesPerSec;
    pFVar8->nSamplesPerSec = pSourceFormat->nSamplesPerSec;
    pFVar8->nAvgBytesPerSec = uVar4;
    uVar2 = pSourceFormat->wBitsPerSample;
    pFVar8->nBlockAlign = pSourceFormat->nBlockAlign;
    pFVar8->wBitsPerSample = uVar2;
    pFVar8->cbSize = 0x16;
    pFVar8[1].wFormatTag = pSourceFormat->wBitsPerSample;
    *(undefined4 *)&pFVar8[1].nChannels = 0;
    uVar2 = pSourceFormat->wFormatTag;
    if (uVar2 == 1) {
      pFVar14 = &DATAFORMAT_SUBTYPE_PCM;
LAB_001129bb:
      SDL_memcpy((undefined1 *)((long)&pFVar8[1].nSamplesPerSec + 2),pFVar14,0x10);
    }
    else {
      if (uVar2 == 0x161) {
        pFVar14 = &DATAFORMAT_SUBTYPE_WMAUDIO2;
        goto LAB_001129bb;
      }
      if (uVar2 == 3) {
        pFVar14 = &DATAFORMAT_SUBTYPE_IEEE_FLOAT;
        goto LAB_001129bb;
      }
    }
    ((*ppSourceVoice)->field_19).src.format = pFVar8;
  }
  else if (uVar2 == 2) {
    pFVar8 = (FAudioWaveFormatEx *)(*audio->pMalloc)(0x16);
    uVar13 = (ulong)pSourceFormat->cbSize;
    lVar15 = 0x16;
    if (uVar13 < 4) {
      lVar15 = uVar13 + 0x12;
    }
    SDL_memcpy(pFVar8,pSourceFormat,lVar15);
    if (uVar13 < 4) {
      SDL_memset((long)&pFVar8[1].wFormatTag + uVar13,0,4 - uVar13);
    }
    pFVar8->cbSize = 4;
    pFVar8[1].wFormatTag = (pFVar8->nBlockAlign / pFVar8->nChannels) * 2 - 0xc;
LAB_00112951:
    ((*ppSourceVoice)->field_19).src.format = pFVar8;
  }
  else {
    if (uVar2 == 3) goto LAB_0011280a;
    if (uVar2 == 0x166) {
      pFVar8 = (FAudioWaveFormatEx *)(*audio->pMalloc)(0x34);
      uVar13 = (ulong)pSourceFormat->cbSize;
      lVar15 = 0x34;
      if (uVar13 < 0x22) {
        lVar15 = uVar13 + 0x12;
      }
      SDL_memcpy(pFVar8,pSourceFormat,lVar15);
      if (uVar13 < 0x22) {
        SDL_memset((long)&pFVar8[1].wFormatTag + uVar13,0,4 - uVar13);
      }
      pFVar8->cbSize = 0x22;
      goto LAB_00112951;
    }
    if (uVar2 == 0x161) goto LAB_0011280a;
    pFVar8 = (FAudioWaveFormatEx *)(*audio->pMalloc)((ulong)pSourceFormat->cbSize + 0x12);
    ((*ppSourceVoice)->field_19).src.format = pFVar8;
    SDL_memcpy(((*ppSourceVoice)->field_19).src.format,pSourceFormat,
               (ulong)pSourceFormat->cbSize + 0x12);
  }
  ((*ppSourceVoice)->field_19).src.callback = pCallback;
  ((*ppSourceVoice)->field_19).src.active = '\0';
  ((*ppSourceVoice)->field_19).src.freqRatio = 1.0;
  ((*ppSourceVoice)->field_19).src.totalSamples = 0;
  ((*ppSourceVoice)->field_19).src.bufferList = (FAudioBufferEntry *)0x0;
  ((*ppSourceVoice)->field_19).src.flushList = (FAudioBufferEntry *)0x0;
  pvVar7 = FAudio_PlatformCreateMutex();
  ((*ppSourceVoice)->field_19).src.bufferLock = pvVar7;
  pFVar6 = *ppSourceVoice;
  pFVar8 = (pFVar6->field_19).src.format;
  uVar2 = pFVar8->wFormatTag;
  if (uVar2 == 2) {
    if (pFVar8->nChannels == 2) {
      pcVar11 = FAudio_INTERNAL_DecodeStereoMSADPCM;
    }
    else {
      pcVar11 = FAudio_INTERNAL_DecodeMonoMSADPCM;
    }
LAB_00112b65:
    (pFVar6->field_19).src.decode = pcVar11;
  }
  else {
    if (uVar2 == 0x166) {
LAB_00112ad8:
      pcVar11 = FAudio_INTERNAL_DecodeWMAERROR;
      goto LAB_00112b65;
    }
    if (uVar2 == 0xfffe) {
      puVar1 = (undefined1 *)((long)&pFVar8[1].nSamplesPerSec + 2);
      iVar5 = SDL_memcmp(puVar1,&DATAFORMAT_SUBTYPE_PCM,0x10);
      if (iVar5 == 0) {
        switch(pFVar8->wBitsPerSample << 0xd | (ushort)(pFVar8->wBitsPerSample - 8) >> 3) {
        case 0:
          pFVar6 = *ppSourceVoice;
          pcVar11 = FAudio_INTERNAL_DecodePCM8;
          break;
        case 1:
          pFVar6 = *ppSourceVoice;
LAB_00112b5e:
          pcVar11 = FAudio_INTERNAL_DecodePCM16;
          break;
        case 2:
          pFVar6 = *ppSourceVoice;
          pcVar11 = FAudio_INTERNAL_DecodePCM24;
          break;
        case 3:
          pFVar6 = *ppSourceVoice;
          pcVar11 = FAudio_INTERNAL_DecodePCM32;
          break;
        default:
          goto switchD_00112b21_default;
        }
        goto LAB_00112b65;
      }
      iVar5 = SDL_memcmp(puVar1,&DATAFORMAT_SUBTYPE_IEEE_FLOAT,0x10);
      if (iVar5 == 0) {
        pFVar6 = *ppSourceVoice;
        if (pFVar8->wBitsPerSample == 0x10) goto LAB_00112b5e;
        pcVar11 = FAudio_INTERNAL_DecodePCM32F;
        goto LAB_00112b65;
      }
      iVar5 = SDL_memcmp(puVar1,&DATAFORMAT_SUBTYPE_WMAUDIO2,0x10);
      if (((iVar5 == 0) ||
          (iVar5 = SDL_memcmp(puVar1,&DATAFORMAT_SUBTYPE_WMAUDIO3,0x10), iVar5 == 0)) ||
         (iVar5 = SDL_memcmp(puVar1,&DATAFORMAT_SUBTYPE_WMAUDIO_LOSSLESS,0x10), iVar5 == 0)) {
        pFVar6 = *ppSourceVoice;
        goto LAB_00112ad8;
      }
    }
  }
switchD_00112b21_default:
  uVar2 = (((*ppSourceVoice)->field_19).src.format)->nChannels;
  if (uVar2 == 2) {
    pp_Var12 = &FAudio_INTERNAL_ResampleStereo;
  }
  else {
    if (uVar2 != 1) {
      pcVar11 = FAudio_INTERNAL_ResampleGeneric;
      goto LAB_00112ba5;
    }
    pp_Var12 = &FAudio_INTERNAL_ResampleMono;
  }
  pcVar11 = *pp_Var12;
LAB_00112ba5:
  ((*ppSourceVoice)->field_19).src.resample = pcVar11;
  ((*ppSourceVoice)->field_19).src.curBufferOffset = 0;
  FAudio_INTERNAL_VoiceOutputFrequency(*ppSourceVoice,pSendList);
  FAudioVoice_SetEffectChain(*ppSourceVoice,pEffectChain);
  pFVar6 = *ppSourceVoice;
  pFVar6->volume = 1.0;
  pfVar9 = (float *)(*audio->pMalloc)((ulong)pFVar6->outputChannels << 2);
  (*ppSourceVoice)->channelVolume = pfVar9;
  voice = *ppSourceVoice;
  uVar3 = voice->outputChannels;
  for (uVar13 = 0; uVar3 != uVar13; uVar13 = uVar13 + 1) {
    voice->channelVolume[uVar13] = 1.0;
  }
  FAudioVoice_SetOutputVoices(voice,pSendList);
  if ((Flags & 8) != 0) {
    pafVar10 = (FAudioFilterState *)
               (*audio->pMalloc)((ulong)(((*ppSourceVoice)->field_19).src.format)->nChannels << 4);
    (*ppSourceVoice)->filterState = pafVar10;
    SDL_memset((*ppSourceVoice)->filterState,0,
               (ulong)(((*ppSourceVoice)->field_19).src.format)->nChannels << 4);
  }
  dVar16 = (double)SDL_ceil(((double)(((*ppSourceVoice)->field_19).src.format)->nSamplesPerSec *
                            (double)MaxFrequencyRatio * (double)audio->updateSize) /
                            (double)(audio->master->field_19).master.inputSampleRate);
  ((*ppSourceVoice)->field_19).src.decodeSamples =
       (int)(long)dVar16 + (uint)(((*ppSourceVoice)->field_19).src.format)->nChannels * 2;
  FAudio_INTERNAL_ResizeDecodeCache
            (audio,(uint)(((*ppSourceVoice)->field_19).src.format)->nChannels *
                   (((*ppSourceVoice)->field_19).src.decodeSamples + 2));
  LinkedList_PrependEntry(&audio->sources,*ppSourceVoice,audio->sourceLock,audio->pMalloc);
  audio->refcount = audio->refcount + 1;
  return 0;
}

Assistant:

uint32_t FAudio_CreateSourceVoice(
	FAudio *audio,
	FAudioSourceVoice **ppSourceVoice,
	const FAudioWaveFormatEx *pSourceFormat,
	uint32_t Flags,
	float MaxFrequencyRatio,
	FAudioVoiceCallback *pCallback,
	const FAudioVoiceSends *pSendList,
	const FAudioEffectChain *pEffectChain
) {
	uint32_t i;

	LOG_API_ENTER(audio)
	LOG_FORMAT(audio, pSourceFormat)

	*ppSourceVoice = (FAudioSourceVoice*) audio->pMalloc(sizeof(FAudioVoice));
	FAudio_zero(*ppSourceVoice, sizeof(FAudioSourceVoice));
	(*ppSourceVoice)->audio = audio;
	(*ppSourceVoice)->type = FAUDIO_VOICE_SOURCE;
	(*ppSourceVoice)->flags = Flags;
	(*ppSourceVoice)->filter.Type = FAUDIO_DEFAULT_FILTER_TYPE;
	(*ppSourceVoice)->filter.Frequency = FAUDIO_DEFAULT_FILTER_FREQUENCY;
	(*ppSourceVoice)->filter.OneOverQ = FAUDIO_DEFAULT_FILTER_ONEOVERQ;
	(*ppSourceVoice)->sendLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE(audio, (*ppSourceVoice)->sendLock)
	(*ppSourceVoice)->effectLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE(audio, (*ppSourceVoice)->effectLock)
	(*ppSourceVoice)->filterLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE(audio, (*ppSourceVoice)->filterLock)
	(*ppSourceVoice)->volumeLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE(audio, (*ppSourceVoice)->volumeLock)

	/* Source Properties */
	FAudio_assert(MaxFrequencyRatio <= FAUDIO_MAX_FREQ_RATIO);
	(*ppSourceVoice)->src.maxFreqRatio = MaxFrequencyRatio;

	if (	pSourceFormat->wFormatTag == FAUDIO_FORMAT_PCM ||
		pSourceFormat->wFormatTag == FAUDIO_FORMAT_IEEE_FLOAT ||
		pSourceFormat->wFormatTag == FAUDIO_FORMAT_WMAUDIO2	)
	{
		FAudioWaveFormatExtensible *fmtex = (FAudioWaveFormatExtensible*) audio->pMalloc(
			sizeof(FAudioWaveFormatExtensible)
		);
		/* convert PCM to EXTENSIBLE */
		fmtex->Format.wFormatTag = FAUDIO_FORMAT_EXTENSIBLE;
		fmtex->Format.nChannels = pSourceFormat->nChannels;
		fmtex->Format.nSamplesPerSec = pSourceFormat->nSamplesPerSec;
		fmtex->Format.nAvgBytesPerSec = pSourceFormat->nAvgBytesPerSec;
		fmtex->Format.nBlockAlign = pSourceFormat->nBlockAlign;
		fmtex->Format.wBitsPerSample = pSourceFormat->wBitsPerSample;
		fmtex->Format.cbSize = sizeof(FAudioWaveFormatExtensible) - sizeof(FAudioWaveFormatEx);
		fmtex->Samples.wValidBitsPerSample = pSourceFormat->wBitsPerSample;
		fmtex->dwChannelMask = 0;
		if (pSourceFormat->wFormatTag == FAUDIO_FORMAT_PCM)
		{
			FAudio_memcpy(&fmtex->SubFormat, &DATAFORMAT_SUBTYPE_PCM, sizeof(FAudioGUID));
		}
		else if (pSourceFormat->wFormatTag == FAUDIO_FORMAT_IEEE_FLOAT)
		{
			FAudio_memcpy(&fmtex->SubFormat, &DATAFORMAT_SUBTYPE_IEEE_FLOAT, sizeof(FAudioGUID));
		}
		else if (pSourceFormat->wFormatTag == FAUDIO_FORMAT_WMAUDIO2)
		{
			FAudio_memcpy(&fmtex->SubFormat, &DATAFORMAT_SUBTYPE_WMAUDIO2, sizeof(FAudioGUID));
		}
		(*ppSourceVoice)->src.format = &fmtex->Format;
	}
	else if (pSourceFormat->wFormatTag == FAUDIO_FORMAT_MSADPCM)
	{
		FAudioADPCMWaveFormat *fmtex = (FAudioADPCMWaveFormat*) audio->pMalloc(
			sizeof(FAudioADPCMWaveFormat)
		);

		/* Copy what we can, ideally the sizes match! */
		size_t cbSize = sizeof(FAudioWaveFormatEx) + pSourceFormat->cbSize;
		FAudio_memcpy(
			fmtex,
			pSourceFormat,
			FAudio_min(cbSize, sizeof(FAudioADPCMWaveFormat))
		);
		if (cbSize < sizeof(FAudioADPCMWaveFormat))
		{
			FAudio_zero(
				((uint8_t*) fmtex) + cbSize,
				sizeof(FAudioADPCMWaveFormat) - cbSize
			);
		}

		/* XAudio2 does not validate this input! */
		fmtex->wfx.cbSize = sizeof(FAudioADPCMWaveFormat) - sizeof(FAudioWaveFormatEx);
		fmtex->wSamplesPerBlock = ((
			fmtex->wfx.nBlockAlign / fmtex->wfx.nChannels
		) - 6) * 2;
		(*ppSourceVoice)->src.format = &fmtex->wfx;
	}
	else if (pSourceFormat->wFormatTag == FAUDIO_FORMAT_XMAUDIO2)
	{
		FAudioXMA2WaveFormat *fmtex = (FAudioXMA2WaveFormat*) audio->pMalloc(
			sizeof(FAudioXMA2WaveFormat)
		);

		/* Copy what we can, ideally the sizes match! */
		size_t cbSize = sizeof(FAudioWaveFormatEx) + pSourceFormat->cbSize;
		FAudio_memcpy(
			fmtex,
			pSourceFormat,
			FAudio_min(cbSize, sizeof(FAudioXMA2WaveFormat))
		);
		if (cbSize < sizeof(FAudioXMA2WaveFormat))
		{
			FAudio_zero(
				((uint8_t*) fmtex) + cbSize,
				sizeof(FAudioADPCMWaveFormat) - cbSize
			);
		}

		/* Does XAudio2 validate this input?! */
		fmtex->wfx.cbSize = sizeof(FAudioXMA2WaveFormat) - sizeof(FAudioWaveFormatEx);
		(*ppSourceVoice)->src.format = &fmtex->wfx;
	}
	else
	{
		/* direct copy anything else */
		(*ppSourceVoice)->src.format = (FAudioWaveFormatEx*) audio->pMalloc(
			sizeof(FAudioWaveFormatEx) + pSourceFormat->cbSize
		);
		FAudio_memcpy(
			(*ppSourceVoice)->src.format,
			pSourceFormat,
			sizeof(FAudioWaveFormatEx) + pSourceFormat->cbSize
		);
	}

	(*ppSourceVoice)->src.callback = pCallback;
	(*ppSourceVoice)->src.active = 0;
	(*ppSourceVoice)->src.freqRatio = 1.0f;
	(*ppSourceVoice)->src.totalSamples = 0;
	(*ppSourceVoice)->src.bufferList = NULL;
	(*ppSourceVoice)->src.flushList = NULL;
	(*ppSourceVoice)->src.bufferLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE(audio, (*ppSourceVoice)->src.bufferLock)

	if ((*ppSourceVoice)->src.format->wFormatTag == FAUDIO_FORMAT_EXTENSIBLE)
	{
		FAudioWaveFormatExtensible *fmtex = (FAudioWaveFormatExtensible*) (*ppSourceVoice)->src.format;

		#define COMPARE_GUID(type) \
			(FAudio_memcmp( \
				&fmtex->SubFormat, \
				&DATAFORMAT_SUBTYPE_##type, \
				sizeof(FAudioGUID) \
			) == 0)
		if (COMPARE_GUID(PCM))
		{
			#define DECODER(bit) \
				if (fmtex->Format.wBitsPerSample == bit) \
				{ \
					(*ppSourceVoice)->src.decode = FAudio_INTERNAL_DecodePCM##bit; \
				}
			DECODER(16)
			else DECODER(8)
			else DECODER(24)
			else DECODER(32)
			else
			{
				LOG_ERROR(
					audio,
					"Unrecognized wBitsPerSample: %d",
					fmtex->Format.wBitsPerSample
				)
				FAudio_assert(0 && "Unrecognized wBitsPerSample!");
			}
			#undef DECODER
		}
		else if (COMPARE_GUID(IEEE_FLOAT))
		{
			/* FIXME: Weird behavior!
			 * Prototype creates a source with the IEEE_FLOAT tag,
			 * but it's actually PCM16. It seems to prioritize
			 * wBitsPerSample over the format tag. Not sure if we
			 * should fold this section into the section above...?
			 * -flibit
			 */
			if (fmtex->Format.wBitsPerSample == 16)
			{
				(*ppSourceVoice)->src.decode = FAudio_INTERNAL_DecodePCM16;
			}
			else
			{
				(*ppSourceVoice)->src.decode = FAudio_INTERNAL_DecodePCM32F;
			}
		}
		else if (	COMPARE_GUID(WMAUDIO2) ||
				COMPARE_GUID(WMAUDIO3) ||
				COMPARE_GUID(WMAUDIO_LOSSLESS)	)
		{
#ifdef HAVE_WMADEC
			if (FAudio_WMADEC_init(*ppSourceVoice, fmtex->SubFormat.Data1) != 0)
			{
				(*ppSourceVoice)->src.decode = FAudio_INTERNAL_DecodeWMAERROR;
			}
#else
			FAudio_assert(0 && "xWMA is not supported!");
			(*ppSourceVoice)->src.decode = FAudio_INTERNAL_DecodeWMAERROR;
#endif /* HAVE_WMADEC */
		}
		else
		{
			FAudio_assert(0 && "Unsupported WAVEFORMATEXTENSIBLE subtype!");
		}
		#undef COMPARE_GUID
	}
	else if ((*ppSourceVoice)->src.format->wFormatTag == FAUDIO_FORMAT_XMAUDIO2)
	{
#ifdef HAVE_WMADEC
		if (FAudio_WMADEC_init(*ppSourceVoice, FAUDIO_FORMAT_XMAUDIO2) != 0)
		{
			(*ppSourceVoice)->src.decode = FAudio_INTERNAL_DecodeWMAERROR;
		}
#else
		FAudio_assert(0 && "XMA2 is not supported!");
		(*ppSourceVoice)->src.decode = FAudio_INTERNAL_DecodeWMAERROR;
#endif /* HAVE_WMADEC */
	}
	else if ((*ppSourceVoice)->src.format->wFormatTag == FAUDIO_FORMAT_MSADPCM)
	{
		(*ppSourceVoice)->src.decode = ((*ppSourceVoice)->src.format->nChannels == 2) ?
			FAudio_INTERNAL_DecodeStereoMSADPCM :
			FAudio_INTERNAL_DecodeMonoMSADPCM;
	}
	else
	{
		FAudio_assert(0 && "Unsupported format tag!");
	}

	if ((*ppSourceVoice)->src.format->nChannels == 1)
	{
		(*ppSourceVoice)->src.resample = FAudio_INTERNAL_ResampleMono;
	}
	else if ((*ppSourceVoice)->src.format->nChannels == 2)
	{
		(*ppSourceVoice)->src.resample = FAudio_INTERNAL_ResampleStereo;
	}
	else
	{
		(*ppSourceVoice)->src.resample = FAudio_INTERNAL_ResampleGeneric;
	}

	(*ppSourceVoice)->src.curBufferOffset = 0;

	/* Sends/Effects */
	FAudio_INTERNAL_VoiceOutputFrequency(*ppSourceVoice, pSendList);
	FAudioVoice_SetEffectChain(*ppSourceVoice, pEffectChain);

	/* Default Levels */
	(*ppSourceVoice)->volume = 1.0f;
	(*ppSourceVoice)->channelVolume = (float*) audio->pMalloc(
		sizeof(float) * (*ppSourceVoice)->outputChannels
	);
	for (i = 0; i < (*ppSourceVoice)->outputChannels; i += 1)
	{
		(*ppSourceVoice)->channelVolume[i] = 1.0f;
	}

	FAudioVoice_SetOutputVoices(*ppSourceVoice, pSendList);

	/* Filters */
	if (Flags & FAUDIO_VOICE_USEFILTER)
	{
		(*ppSourceVoice)->filterState = (FAudioFilterState*) audio->pMalloc(
			sizeof(FAudioFilterState) * (*ppSourceVoice)->src.format->nChannels
		);
		FAudio_zero(
			(*ppSourceVoice)->filterState,
			sizeof(FAudioFilterState) * (*ppSourceVoice)->src.format->nChannels
		);
	}

	/* Sample Storage */
	(*ppSourceVoice)->src.decodeSamples = (uint32_t) (FAudio_ceil(
		(double) audio->updateSize *
		(double) MaxFrequencyRatio *
		(double) (*ppSourceVoice)->src.format->nSamplesPerSec /
		(double) audio->master->master.inputSampleRate
	)) + EXTRA_DECODE_PADDING * (*ppSourceVoice)->src.format->nChannels;
	FAudio_INTERNAL_ResizeDecodeCache(
		audio,
		((*ppSourceVoice)->src.decodeSamples + EXTRA_DECODE_PADDING) * (*ppSourceVoice)->src.format->nChannels
	);

	LOG_INFO(audio, "-> %p", (void*) (*ppSourceVoice))

	/* Add to list, finally. */
	LinkedList_PrependEntry(
		&audio->sources,
		*ppSourceVoice,
		audio->sourceLock,
		audio->pMalloc
	);
	FAudio_AddRef(audio);

#ifdef FAUDIO_DUMP_VOICES
	FAudio_DUMPVOICE_Init(*ppSourceVoice);
#endif /* FAUDIO_DUMP_VOICES */

	LOG_API_EXIT(audio)
	return 0;
}